

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O3

int XLearnGetStr(XL *out,char *key,string *value)

{
  int iVar1;
  
  iVar1 = strcmp(key,"task");
  if ((((iVar1 == 0) || (iVar1 = strcmp(key,"metric"), iVar1 == 0)) ||
      (iVar1 = strcmp(key,"log"), iVar1 == 0)) ||
     ((iVar1 = strcmp(key,"loss"), iVar1 == 0 || (iVar1 = strcmp(key,"opt"), iVar1 == 0)))) {
    std::__cxx11::string::_M_assign((string *)value);
  }
  return 0;
}

Assistant:

XL_DLL int XLearnGetStr(XL *out, const char *key, std::string& value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "task") == 0) {
    value = xl->GetHyperParam().loss_func;
  } else if (strcmp(key, "metric") == 0) {
    value = xl->GetHyperParam().metric;
  } else if (strcmp(key, "log") == 0) {
    value = xl->GetHyperParam().log_file;
  } else if (strcmp(key, "loss") == 0) {
    value = xl->GetHyperParam().loss_func;
  } else if (strcmp(key, "opt") == 0) {
    value = xl->GetHyperParam().opt_type;
  }
  API_END();
}